

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O1

bool __thiscall
Minisat::OnlineProofChecker::removeClause<Minisat::Clause>(OnlineProofChecker *this,Clause *cls)

{
  int *piVar1;
  ulong *puVar2;
  vec<Minisat::Watcher> *pvVar3;
  int iVar4;
  Lit *pLVar5;
  pointer puVar6;
  pointer pvVar7;
  long lVar8;
  uint *puVar9;
  vec<Minisat::Watcher> *pvVar10;
  uint32_t uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  CRef CVar20;
  ulong uVar21;
  long lVar22;
  pointer puVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  
  if (3 < this->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] remove clause ",0x1c);
    if (0x3ffffffff < (ulong)cls->header) {
      uVar15 = 0;
      do {
        uVar12 = *(uint *)(&cls[1].header.field_0x0 + uVar15 * 4);
        uVar17 = (int)uVar12 >> 1;
        uVar19 = ~uVar17;
        if ((uVar12 & 1) == 0) {
          uVar19 = uVar17 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar19);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
        uVar15 = uVar15 + 1;
      } while (uVar15 < (ulong)cls->header >> 0x22);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    printState(this);
  }
  if (((ulong)cls->header < 0x400000000) || (this->ok != true)) {
LAB_00125258:
    bVar26 = true;
  }
  else if (((ulong)cls->header & 0xfffffffc00000000) == 0x400000000) {
    uVar15 = (ulong)(this->unitClauses).sz;
    bVar26 = 0 < (long)uVar15;
    if (0 < (long)uVar15) {
      pLVar5 = (this->unitClauses).data;
      uVar13 = 0;
      do {
        if (pLVar5[uVar13].x == *(int *)&cls[1].header) {
          pLVar5[uVar13].x = pLVar5[uVar15 - 1].x;
          piVar1 = &(this->unitClauses).sz;
          *piVar1 = *piVar1 + -1;
          if (1 < this->verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ",0x1d);
            if (0x3ffffffff < (ulong)cls->header) {
              uVar15 = 0;
              do {
                uVar12 = *(uint *)(&cls[1].header.field_0x0 + uVar15 * 4);
                uVar17 = (int)uVar12 >> 1;
                uVar19 = ~uVar17;
                if ((uVar12 & 1) == 0) {
                  uVar19 = uVar17 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar19);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                uVar15 = uVar15 + 1;
              } while (uVar15 < (ulong)cls->header >> 0x22);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
            std::ostream::put('X');
            std::ostream::flush();
          }
          goto LAB_00125258;
        }
        uVar13 = uVar13 + 1;
      } while (uVar15 != uVar13);
      bVar26 = uVar13 < uVar15;
    }
  }
  else {
    if (0x3fffffff < (this->ma).step) {
      puVar6 = (this->ma).array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      memset(puVar6,0,(long)(this->ma).array.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar6);
      (this->ma).step = 0;
    }
    uVar11 = (this->ma).step + 1;
    (this->ma).step = uVar11;
    puVar6 = (this->ma).array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar6[*(uint *)&cls[1].header] = uVar11;
    uVar12 = 0;
    if ((ulong)cls->header >> 0x23 != 0) {
      pvVar7 = (this->occ).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = 1;
      uVar19 = 0;
      do {
        puVar6[*(uint *)(&cls[1].header.field_0x0 + uVar15 * 4)] = (this->ma).step;
        iVar4 = *(int *)(&cls[1].header.field_0x0 + uVar15 * 4);
        uVar12 = (uint)uVar15;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar7[(int)uVar19].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar7[(int)uVar19].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data) <=
            (ulong)((long)*(pointer *)
                           ((long)&pvVar7[iVar4].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar7[iVar4].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data)) {
          uVar12 = uVar19;
        }
        uVar15 = uVar15 + 1;
        uVar19 = uVar12;
      } while (uVar15 < (ulong)cls->header >> 0x22);
    }
    iVar4 = *(int *)(&cls[1].header.field_0x0 + (long)(int)uVar12 * 4);
    pvVar7 = (this->occ).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar4;
    lVar8 = *(long *)&(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data;
    puVar23 = *(pointer *)
               ((long)&(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data + 8);
    lVar25 = (long)puVar23 - lVar8;
    if (lVar25 == 0) {
      uVar13 = 0;
      uVar15 = 0xffffffff;
    }
    else {
      puVar9 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      uVar15 = 0xffffffff;
      uVar13 = 0;
      do {
        uVar16 = (ulong)*(uint *)(lVar8 + uVar13 * 4);
        uVar21 = *(ulong *)(puVar9 + uVar16);
        uVar24 = uVar21 >> 0x22;
        bVar26 = true;
        if (uVar24 == (ulong)cls->header >> 0x22) {
          bVar27 = 0x3ffffffff < uVar21;
          if (0x3ffffffff < uVar21) {
            uVar19 = (this->ma).step;
            if (puVar6[puVar9[uVar16 + 2]] == uVar19) {
              uVar21 = 0;
              do {
                if (uVar24 - 1 == uVar21) goto LAB_00124cc1;
                lVar14 = uVar21 + 3;
                uVar21 = uVar21 + 1;
              } while (puVar6[puVar9[uVar16 + lVar14]] == uVar19);
              bVar27 = uVar21 < uVar24;
            }
            if (bVar27) goto LAB_00124ce5;
          }
LAB_00124cc1:
          *(undefined4 *)(lVar8 + uVar13 * 4) = *(undefined4 *)(lVar8 + -4 + lVar25);
          *(pointer *)
           ((long)&(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data + 8) = puVar23 + -1;
          uVar13 = 0xffffffffffffffff;
          bVar26 = false;
          uVar15 = uVar16;
        }
LAB_00124ce5:
        if (!bVar26) break;
        uVar13 = uVar13 + 1;
        puVar23 = *(pointer *)
                   ((long)&(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data + 8);
        lVar25 = (long)puVar23 - lVar8;
      } while (uVar13 < (ulong)(lVar25 >> 2));
    }
    bVar27 = uVar13 != (long)*(pointer *)
                              ((long)&(pvVar7->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data + 8) - lVar8 >> 2;
    CVar20 = (CRef)uVar15;
    bVar26 = CVar20 != 0xffffffff && bVar27;
    if (CVar20 != 0xffffffff && bVar27) {
      if (0x3ffffffff < (ulong)cls->header) {
        uVar13 = 0;
        do {
          if (uVar13 != uVar12) {
            pvVar7 = (this->occ).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(int *)(&cls[1].header.field_0x0 + uVar13 * 4);
            lVar8 = *(long *)&(pvVar7->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data;
            puVar6 = *(pointer *)
                      ((long)&(pvVar7->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data + 8);
            lVar25 = (long)puVar6 - lVar8;
            if (lVar25 == 0) {
              lVar14 = 0;
            }
            else {
              lVar14 = (lVar25 >> 2) + (ulong)(lVar25 >> 2 == 0);
              lVar22 = 0;
              do {
                if (*(CRef *)(lVar8 + lVar22 * 4) == CVar20) {
                  *(undefined4 *)(lVar8 + lVar22 * 4) = *(undefined4 *)(lVar8 + -4 + lVar25);
                  *(pointer *)
                   ((long)&(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data + 8) = puVar6 + -1;
                  lVar14 = -1;
                  break;
                }
                lVar22 = lVar22 + 1;
              } while (lVar14 != lVar22);
            }
            if (lVar14 == (long)*(pointer *)
                                 ((long)&(pvVar7->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data + 8) - lVar8 >> 2) {
              if (1 < this->verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c could not remove clause ",0x1a);
                if (0x3ffffffff < (ulong)cls->header) {
                  uVar21 = 0;
                  do {
                    uVar19 = *(uint *)(&cls[1].header.field_0x0 + uVar21 * 4);
                    uVar18 = (int)uVar19 >> 1;
                    uVar17 = ~uVar18;
                    if ((uVar19 & 1) == 0) {
                      uVar17 = uVar18 + 1;
                    }
                    std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                    uVar21 = uVar21 + 1;
                  } while (uVar21 < (ulong)cls->header >> 0x22);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr," from list of literal ",0x16);
                uVar19 = *(uint *)(&cls[1].header.field_0x0 + uVar13 * 4);
                uVar18 = (int)uVar19 >> 1;
                uVar17 = ~uVar18;
                if ((uVar19 & 1) == 0) {
                  uVar17 = uVar18 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                std::ostream::flush();
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                std::ostream::put('X');
                std::ostream::flush();
              }
              printState(this);
              if (2 < this->verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c list for ",0xb);
                uVar19 = *(uint *)(&cls[1].header.field_0x0 + uVar13 * 4);
                uVar18 = (int)uVar19 >> 1;
                uVar17 = ~uVar18;
                if ((uVar19 & 1) == 0) {
                  uVar17 = uVar18 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," : ",3);
                if (*(pointer *)
                     ((long)&(pvVar7->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data + 8) !=
                    (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start) {
                  uVar21 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"c ",2)
                    ;
                    uVar19 = *(uint *)(*(long *)&(pvVar7->
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 )._M_impl.super__Vector_impl_data + uVar21 * 4);
                    puVar9 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
                    if (0x3ffffffff < *(ulong *)(puVar9 + uVar19)) {
                      puVar2 = (ulong *)(puVar9 + uVar19);
                      uVar16 = 0;
                      do {
                        uVar19 = *(uint *)((long)puVar2 + uVar16 * 4 + 8);
                        uVar18 = (int)uVar19 >> 1;
                        uVar17 = ~uVar18;
                        if ((uVar19 & 1) == 0) {
                          uVar17 = uVar18 + 1;
                        }
                        std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                        std::ostream::flush();
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr," ",1);
                        uVar16 = uVar16 + 1;
                      } while (uVar16 < *puVar2 >> 0x22);
                    }
                    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                    std::ostream::put('X');
                    std::ostream::flush();
                    uVar21 = uVar21 + 1;
                  } while (uVar21 < (ulong)((long)*(pointer *)
                                                   ((long)&(pvVar7->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                            *(long *)&(pvVar7->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data >> 2));
                }
              }
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)cls->header >> 0x22);
      }
      puVar9 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      pvVar10 = (this->watches).occs.data;
      uVar13 = (long)(int)puVar9[uVar15 + 2] ^ 1;
      pvVar3 = pvVar10 + uVar13;
      uVar12 = pvVar10[uVar13].sz;
      if ((long)(int)uVar12 < 1) {
        uVar13 = 0;
      }
      else {
        uVar21 = 0;
        do {
          uVar13 = uVar21;
          if (pvVar3->data[uVar21].cref == CVar20) break;
          uVar21 = uVar21 + 1;
          uVar13 = (ulong)uVar12;
        } while (uVar12 != uVar21);
        uVar13 = uVar13 & 0xffffffff;
      }
      pvVar3->data[uVar13] = pvVar3->data[(long)(int)uVar12 + -1];
      pvVar3->sz = pvVar3->sz + -1;
      uVar13 = (long)(int)puVar9[uVar15 + 3] ^ 1;
      pvVar10 = (this->watches).occs.data;
      pvVar3 = pvVar10 + uVar13;
      uVar12 = pvVar10[uVar13].sz;
      if ((long)(int)uVar12 < 1) {
        uVar13 = 0;
      }
      else {
        uVar21 = 0;
        do {
          uVar13 = uVar21;
          if (pvVar3->data[uVar21].cref == CVar20) break;
          uVar21 = uVar21 + 1;
          uVar13 = (ulong)uVar12;
        } while (uVar12 != uVar21);
        uVar13 = uVar13 & 0xffffffff;
      }
      pvVar3->data[uVar13] = pvVar3->data[(long)(int)uVar12 + -1];
      pvVar3->sz = pvVar3->sz + -1;
      puVar9 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      *(ulong *)(puVar9 + uVar15) = (*(ulong *)(puVar9 + uVar15) & 0xfffffffffffffffc) + 1;
      uVar13 = *(ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar15);
      uVar12 = 2;
      if ((uVar13 & 4) == 0) {
        uVar12 = (uint)(uVar13 >> 3) & 1;
      }
      (this->ca).super_RegionAllocator<unsigned_int>.wasted_ =
           (uint)(uVar13 >> 0x22) + (this->ca).super_RegionAllocator<unsigned_int>.wasted_ + uVar12
           + 2;
      if (1 < this->verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ",0x1d);
        if (0x3ffffffff < (ulong)cls->header) {
          uVar13 = 0;
          do {
            uVar12 = *(uint *)(&cls[1].header.field_0x0 + uVar13 * 4);
            uVar17 = (int)uVar12 >> 1;
            uVar19 = ~uVar17;
            if ((uVar12 & 1) == 0) {
              uVar19 = uVar17 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar19);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            uVar13 = uVar13 + 1;
          } while (uVar13 < (ulong)cls->header >> 0x22);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," which is internally ",0x15);
        puVar9 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        if (0x3ffffffff < *(ulong *)(puVar9 + uVar15)) {
          puVar2 = (ulong *)(puVar9 + uVar15);
          uVar15 = 0;
          do {
            uVar12 = *(uint *)((long)puVar2 + uVar15 * 4 + 8);
            uVar17 = (int)uVar12 >> 1;
            uVar19 = ~uVar17;
            if ((uVar12 & 1) == 0) {
              uVar19 = uVar17 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar19);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            uVar15 = uVar15 + 1;
          } while (uVar15 < *puVar2 >> 0x22);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
      }
    }
    else {
      if (1 < this->verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] could not remove clause ",0x26);
        if (0x3ffffffff < (ulong)cls->header) {
          uVar15 = 0;
          do {
            uVar12 = *(uint *)(&cls[1].header.field_0x0 + uVar15 * 4);
            uVar17 = (int)uVar12 >> 1;
            uVar19 = ~uVar17;
            if ((uVar12 & 1) == 0) {
              uVar19 = uVar17 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar19);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            uVar15 = uVar15 + 1;
          } while (uVar15 < (ulong)cls->header >> 0x22);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," from list of literal ",0x16);
        uVar12 = ~(iVar4 >> 1);
        if (((long)iVar4 & 1U) == 0) {
          uVar12 = (iVar4 >> 1) + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar12);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
      }
      printState(this);
    }
  }
  return bVar26;
}

Assistant:

inline bool OnlineProofChecker::removeClause(const T &cls)
{
    if (verbose > 3) {
        std::cerr << "c [DRAT-OTFC] remove clause " << cls << std::endl;
        printState();
    }

    if (cls.size() == 0 || !ok) {
        return true;
    } // do not handle empty clauses here!
    if (cls.size() == 1) {
        const Lit l = cls[0];
        int i = 0;
        bool found = false;
        for (; i < unitClauses.size(); ++i) {
            if (unitClauses[i] == l) {
                unitClauses[i] = unitClauses[unitClauses.size() - 1];
                unitClauses.pop();
                found = true;
                break; // remove only once!
            }
        }
        if (!found) {
            assert(false && "the unit clause should be inside the vector of units");
            return false;
        }
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] removed clause " << cls << std::endl;
        }
        return true;
    }
    // find correct CRef ...
    ma.nextStep();
    int smallestIndex = 0;
    ma.setCurrentStep(toInt(cls[0]));
    for (int i = 1; i < cls.size(); ++i) {
        ma.setCurrentStep(toInt(cls[i]));
        if (occ[toInt(cls[i])].size() < occ[smallestIndex].size()) {
            smallestIndex = i;
        }
    }

    const Lit smallest = cls[smallestIndex];

    CRef ref = CRef_Undef;
    size_t i = 0;
    for (; i < occ[toInt(smallest)].size(); ++i) {
        const Clause &c = ca[occ[toInt(smallest)][i]];
        if (c.size() != cls.size()) {
            continue;
        } // do not check this clause!

        int hit = 0;
        for (; hit < c.size(); ++hit) {
            if (!ma.isCurrentStep(toInt(c[hit]))) {
                break;
            } // a literal is not in both clauses, not the correct clause
        }
        if (hit < c.size()) {
            continue;
        } // not the right clause -> check next!

        ref = occ[toInt(smallest)][i];
        // remove from this occ-list
        occ[toInt(smallest)][i] = occ[toInt(smallest)][occ[toInt(smallest)].size() - 1];
        occ[toInt(smallest)].pop_back();
        i = ~0; // set to indicate that we found the clause
        break;
    }
    if (i == occ[toInt(smallest)].size() || ref == CRef_Undef) {
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] could not remove clause " << cls << " from list of literal " << smallest << std::endl;
        }
        printState();
        assert(false && "clause should be in the data structures");
        return false;
    }

    // remove from the other occ-lists!
    for (int i = 0; i < cls.size(); ++i) {
        if (i == smallestIndex) {
            continue;
        }
        std::vector<CRef> &list = occ[toInt(cls[i])];
        size_t j = 0;
        for (; j < list.size(); ++j) {
            if (list[j] == ref) {
                list[j] = list[list.size() - 1];
                list.pop_back(); // remove the element
                j = -1;          // point somewhere invalid
                break;
            }
        }
        if (j == list.size()) {
            if (verbose > 1) {
                std::cerr << "c could not remove clause " << cls << " from list of literal " << cls[i] << std::endl;
            }
            printState();
            if (verbose > 2) {
                std::cerr << "c list for " << cls[i] << " : ";
                for (size_t k = 0; k < list.size(); ++k) {
                    std::cerr << "c " << ca[list[k]] << std::endl;
                }
            }
            assert(false && "should be able to remove the clause from all lists");
        }
    }

    // remove the clause from the two watched literal structures!
    detachClause(ref);

    // tell the garbage-collection-system that the clause can be removed
    ca[ref].mark(1);
    ca.free(ref);

    if (verbose > 1) {
        std::cerr << "c [DRAT-OTFC] removed clause " << cls << " which is internally " << ca[ref] << std::endl;
    }
    // check garbage collection once in a while!
    // TODO
    return true;
}